

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O3

bool __thiscall gl4cts::GetTextureSubImage::Errors::testOneDimmensionalTextureErrors(Errors *this)

{
  int iVar1;
  undefined4 extraout_var;
  char *__s;
  size_t sVar2;
  undefined1 local_198 [8];
  _func_int **local_190;
  ios_base local_120 [264];
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  (*this->m_gl_GetTextureSubImage)
            (this->m_texture_1D,0,0,1,0,2,2,1,0x1908,0x1401,0x10,this->m_destination_buffer);
  iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (iVar1 != 0x501) {
    local_198 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_190,
               "GL_INVALID_VALUE error is expected to be generated by glGetTextureSubImage if the effective target is GL_TEXTURE_1D and either yoffset is not zero, or height is not one (OpenGL 4.5 Core Specification chapter 8.11.4). However, the error value "
               ,0xf2);
    __s = glu::getErrorName(iVar1);
    if (__s == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_190 + (int)local_190[-3]);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190," was generated.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
    std::ios_base::~ios_base(local_120);
  }
  return iVar1 == 0x501;
}

Assistant:

bool gl4cts::GetTextureSubImage::Errors::testOneDimmensionalTextureErrors()
{
	/* OpenGL functions access point. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test. */
	m_gl_GetTextureSubImage(m_texture_1D, 0, 0, 1, 0, s_texture_data_width, 2, 1, GL_RGBA, GL_UNSIGNED_BYTE,
							s_destination_buffer_size, m_destination_buffer);

	glw::GLint error_value	 = gl.getError();
	glw::GLint is_proper_error = (GL_INVALID_VALUE == error_value);

	if (!is_proper_error)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "GL_INVALID_VALUE error is expected to be generated by glGetTextureSubImage if the effective"
			   " target is GL_TEXTURE_1D and either yoffset is not zero, or height"
			   " is not one (OpenGL 4.5 Core Specification chapter 8.11.4)."
			   " However, the error value "
			<< glu::getErrorName(error_value) << " was generated." << tcu::TestLog::EndMessage;
	}

	if (is_proper_error)
	{
		return true;
	}

	return false;
}